

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

void __thiscall
CMU462::HDRImageBuffer::toColor
          (HDRImageBuffer *this,ImageBuffer *target,size_t x0,size_t y0,size_t x1,size_t y1)

{
  pointer pSVar1;
  size_t x;
  long lVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  Color local_68;
  long local_58;
  size_t local_50;
  HDRImageBuffer *local_48;
  size_t local_40;
  long local_38;
  
  if (y0 < y1) {
    local_38 = y0 * 0xc;
    local_58 = x0 * 0xc + 8;
    local_50 = y1;
    local_48 = this;
    local_40 = x1;
    do {
      x = x0;
      lVar2 = local_58;
      if (x0 < x1) {
        do {
          lVar3 = this->w * local_38;
          pSVar1 = (this->data).
                   super__Vector_base<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>._M_impl.
                   super__Vector_impl_data._M_start;
          fVar4 = powf(*(float *)((long)pSVar1 + lVar2 + -8 + lVar3) * 1.4142135,0.45454544);
          fVar5 = powf(*(float *)((long)pSVar1 + lVar2 + -4 + lVar3) * 1.4142135,0.45454544);
          local_68.b = powf(*(float *)((long)&pSVar1->r + lVar2 + lVar3) * 1.4142135,0.45454544);
          local_68.a = 1.0;
          local_68.r = fVar4;
          local_68.g = fVar5;
          ImageBuffer::update_pixel(target,&local_68,x,y0);
          x = x + 1;
          lVar2 = lVar2 + 0xc;
          this = local_48;
          x1 = local_40;
        } while (local_40 != x);
      }
      y0 = y0 + 1;
      local_38 = local_38 + 0xc;
    } while (y0 != local_50);
  }
  return;
}

Assistant:

void toColor(ImageBuffer& target, size_t x0, size_t y0, size_t x1, size_t y1) {

      float gamma = 2.2f;
      float level = 1.0f;
      float one_over_gamma = 1.0f / gamma;
      float exposure = sqrt(pow(2,level));
      for (size_t y = y0; y < y1; ++y) {
        for (size_t x = x0; x < x1; ++x) {
          const Spectrum& s = data[x + y * w];
          float r = pow(s.r * exposure, one_over_gamma);
          float g = pow(s.g * exposure, one_over_gamma);
          float b = pow(s.b * exposure, one_over_gamma);
          target.update_pixel(Color(r, g, b, 1.0), x, y);
        }
      }
    }